

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

void replace_object(obj *obj,obj *otmp)

{
  xchar xVar1;
  monst *pmVar2;
  obj *poVar3;
  obj **head_ptr;
  
  xVar1 = obj->where;
  otmp->where = xVar1;
  switch(xVar1) {
  case '\0':
    return;
  case '\x01':
    otmp->nobj = obj->nobj;
    otmp->v = obj->v;
    otmp->ox = obj->ox;
    otmp->oy = obj->oy;
    obj->nobj = otmp;
    (obj->v).v_nexthere = otmp;
    extract_nobj(obj,&obj->olev->objlist);
    extract_nexthere(obj,obj->olev->objects[obj->ox] + obj->oy);
    return;
  case '\x02':
    otmp->nobj = obj->nobj;
    poVar3 = (obj->v).v_nexthere;
    (otmp->v).v_nexthere = poVar3;
    obj->nobj = otmp;
    head_ptr = &poVar3->cobj;
    break;
  case '\x03':
    otmp->nobj = obj->nobj;
    obj->nobj = otmp;
    head_ptr = &invent;
    break;
  case '\x04':
    otmp->nobj = obj->nobj;
    pmVar2 = (obj->v).v_ocarry;
    (otmp->v).v_ocarry = pmVar2;
    obj->nobj = otmp;
    head_ptr = &pmVar2->minvent;
    break;
  default:
    panic("replace_object: obj position");
  }
  extract_nobj(obj,head_ptr);
  return;
}

Assistant:

void replace_object(struct obj *obj, struct obj *otmp)
{
    otmp->where = obj->where;
    switch (obj->where) {
    case OBJ_FREE:
	/* do nothing */
	break;
    case OBJ_INVENT:
	otmp->nobj = obj->nobj;
	obj->nobj = otmp;
	extract_nobj(obj, &invent);
	break;
    case OBJ_CONTAINED:
	otmp->nobj = obj->nobj;
	otmp->ocontainer = obj->ocontainer;
	obj->nobj = otmp;
	extract_nobj(obj, &obj->ocontainer->cobj);
	break;
    case OBJ_MINVENT:
	otmp->nobj = obj->nobj;
	otmp->ocarry =  obj->ocarry;
	obj->nobj = otmp;
	extract_nobj(obj, &obj->ocarry->minvent);
	break;
    case OBJ_FLOOR:
	otmp->nobj = obj->nobj;
	otmp->nexthere = obj->nexthere;
	otmp->ox = obj->ox;
	otmp->oy = obj->oy;
	obj->nobj = otmp;
	obj->nexthere = otmp;
	extract_nobj(obj, &obj->olev->objlist);
	extract_nexthere(obj, &obj->olev->objects[obj->ox][obj->oy]);
	break;
    default:
	panic("replace_object: obj position");
	break;
    }
}